

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventFilter.hpp
# Opt level: O3

size_t __thiscall
binlog::EventFilter::writeAllowed<TestStream>
          (EventFilter *this,char *buffer,size_t bufferSize,TestStream *out)

{
  ulong uVar1;
  bool bVar2;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  ulong *__n;
  _Rb_tree_header *p_Var5;
  int __fd;
  size_t sVar6;
  ulong s;
  Range entries;
  Range payload;
  Range entry;
  EventSource eventSource;
  Range local_130;
  _Rb_tree_header *local_120;
  Range local_118;
  Range local_108;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *local_f8;
  TestStream *local_f0;
  EventSource local_e8;
  
  local_130._end = buffer + bufferSize;
  if (bufferSize == 0) {
    sVar6 = 0;
  }
  else {
    local_f8 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&this->_allowedSourceIds;
    local_120 = &(this->_allowedSourceIds)._M_t._M_impl.super__Rb_tree_header;
    sVar6 = 0;
    local_130._begin = buffer;
    local_f0 = out;
    do {
      local_108._begin = local_130._begin;
      local_108._end = local_130._end;
      Range::throw_if_overflow(&local_130,4);
      s = (ulong)*(uint *)local_130._begin;
      local_130._begin = (char *)((long)local_130._begin + 4);
      Range::throw_if_overflow(&local_130,s);
      local_118._end = (char *)((long)local_130._begin + s);
      local_118._begin = local_130._begin;
      local_130._begin = local_118._end;
      Range::throw_if_overflow(&local_118,8);
      uVar1 = *(ulong *)local_118._begin;
      local_118._begin = (char *)((long)local_118._begin + 8);
      if ((long)uVar1 < 0) {
        __n = (ulong *)local_118._begin;
        if (uVar1 == 0xffffffffffffffff) {
          __n = (ulong *)0x0;
          local_e8.id = 0;
          local_e8.severity = info;
          local_e8.category._M_dataplus._M_p = (pointer)&local_e8.category.field_2;
          local_e8.category._M_string_length = 0;
          local_e8.category.field_2._M_local_buf[0] = '\0';
          local_e8.function._M_dataplus._M_p = (pointer)&local_e8.function.field_2;
          local_e8.function._M_string_length = 0;
          local_e8.function.field_2._M_local_buf[0] = '\0';
          local_e8.file._M_dataplus._M_p = (pointer)&local_e8.file.field_2;
          local_e8.file._M_string_length = 0;
          local_e8.file.field_2._M_local_buf[0] = '\0';
          local_e8.line = 0;
          local_e8.formatString._M_dataplus._M_p = (pointer)&local_e8.formatString.field_2;
          local_e8.formatString._M_string_length = 0;
          local_e8.formatString.field_2._M_local_buf[0] = '\0';
          local_e8.argumentTags._M_dataplus._M_p = (pointer)&local_e8.argumentTags.field_2;
          local_e8.argumentTags._M_string_length = 0;
          local_e8.argumentTags.field_2._M_local_buf[0] = '\0';
          mserialize::
          StructDeserializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
          ::deserialize<binlog::Range>(&local_e8,&local_118);
          if ((this->_isAllowed).super__Function_base._M_manager == (_Manager_type)0x0) {
            uVar3 = std::__throw_bad_function_call();
            EventSource::~EventSource(&local_e8);
            _Unwind_Resume(uVar3);
          }
          bVar2 = (*(this->_isAllowed)._M_invoker)((_Any_data *)this,&local_e8);
          if (bVar2) {
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>(local_f8,&local_e8.id);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.argumentTags._M_dataplus._M_p != &local_e8.argumentTags.field_2) {
            operator_delete(local_e8.argumentTags._M_dataplus._M_p,
                            CONCAT71(local_e8.argumentTags.field_2._M_allocated_capacity._1_7_,
                                     local_e8.argumentTags.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.formatString._M_dataplus._M_p != &local_e8.formatString.field_2) {
            operator_delete(local_e8.formatString._M_dataplus._M_p,
                            CONCAT71(local_e8.formatString.field_2._M_allocated_capacity._1_7_,
                                     local_e8.formatString.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.file._M_dataplus._M_p != &local_e8.file.field_2) {
            operator_delete(local_e8.file._M_dataplus._M_p,
                            CONCAT71(local_e8.file.field_2._M_allocated_capacity._1_7_,
                                     local_e8.file.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.function._M_dataplus._M_p != &local_e8.function.field_2) {
            operator_delete(local_e8.function._M_dataplus._M_p,
                            CONCAT71(local_e8.function.field_2._M_allocated_capacity._1_7_,
                                     local_e8.function.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.category._M_dataplus._M_p != &local_e8.category.field_2) {
            operator_delete(local_e8.category._M_dataplus._M_p,
                            CONCAT71(local_e8.category.field_2._M_allocated_capacity._1_7_,
                                     local_e8.category.field_2._M_local_buf[0]) + 1);
          }
        }
LAB_001a80e8:
        Range::throw_if_overflow(&local_108,(size_t)(s + 4));
        __fd = (int)local_108._begin;
        local_108._begin = (char *)((long)local_108._begin + s + 4);
        TestStream::write(local_f0,__fd,(void *)(s + 4),(size_t)__n);
        sVar6 = sVar6 + s + 4;
      }
      else {
        p_Var4 = (this->_allowedSourceIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = local_120;
        if (p_Var4 != (_Base_ptr)0x0) {
          do {
            if (*(ulong *)(p_Var4 + 1) >= uVar1) {
              p_Var5 = (_Rb_tree_header *)p_Var4;
            }
            p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar1];
          } while (p_Var4 != (_Base_ptr)0x0);
          if ((p_Var5 != local_120) && (__n = (ulong *)0x0, p_Var5->_M_node_count <= uVar1))
          goto LAB_001a80e8;
        }
      }
    } while (local_130._begin != local_130._end);
  }
  return sVar6;
}

Assistant:

std::size_t EventFilter::writeAllowed(const char* buffer, std::size_t bufferSize, OutputStream& out)
{
  std::size_t totalWriteSize = 0;

  Range entries(buffer, bufferSize);

  while (! entries.empty())
  {
    Range entry = entries;
    const std::uint32_t size = entries.read<std::uint32_t>();
    Range payload(entries.view(size), size);
    const std::uint64_t tag = payload.read<std::uint64_t>();
    const bool special = (tag & (std::uint64_t(1) << 63)) != 0;

    if (special)
    {
      // event sources are inspected to populate _allowedSourceIds
      if (tag == EventSource::Tag)
      {
        EventSource eventSource;
        mserialize::deserialize(eventSource, payload);
        if (_isAllowed(eventSource))
        {
          _allowedSourceIds.insert(eventSource.id);
        }
        // else: event source is not allowed, events referencing it
        // will not be written.
      }
    }
    else if (_allowedSourceIds.count(tag) == 0)
    {
      // event is produced by a disallowed source, ignore it
      continue;
    }

    // either special entry or event produced by an allowed source, write it
    // TODO(benedek) perf: batch contiguous entries into one out.write
    const std::size_t sizePrefixedSize = size + sizeof(size);
    out.write(entry.view(sizePrefixedSize), std::streamsize(sizePrefixedSize));
    totalWriteSize += sizePrefixedSize;
  }

  return totalWriteSize;
}